

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int ProvideInput(Context *context)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  
  sVar2 = fread(context->input,1,0x80000,(FILE *)context->fin);
  context->available_in = sVar2;
  context->total_in = context->total_in + sVar2;
  context->next_in = context->input;
  iVar1 = ferror((FILE *)context->fin);
  __stream = _stderr;
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    pcVar5 = "con";
    if (context->current_input_path != (char *)0x0) {
      pcVar5 = context->current_input_path;
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    iVar1 = 0;
    fprintf(__stream,"failed to read input [%s]: %s\n",pcVar5,pcVar4);
  }
  return iVar1;
}

Assistant:

static BROTLI_BOOL ProvideInput(Context* context) {
  context->available_in =
      fread(context->input, 1, kFileBufferSize, context->fin);
  context->total_in += context->available_in;
  context->next_in = context->input;
  if (ferror(context->fin)) {
    fprintf(stderr, "failed to read input [%s]: %s\n",
            PrintablePath(context->current_input_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}